

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

void __thiscall
kj::anon_unknown_36::ConcurrencyLimitingHttpClient::ConnectionCounter::~ConnectionCounter
          (ConnectionCounter *this)

{
  ConnectionCounter *this_local;
  
  if (this->parent != (ConcurrencyLimitingHttpClient *)0x0) {
    this->parent->concurrentRequests = this->parent->concurrentRequests - 1;
    serviceQueue(this->parent);
    fireCountChanged(this->parent);
  }
  return;
}

Assistant:

~ConnectionCounter() noexcept(false) {
      if (parent != nullptr) {
        --parent->concurrentRequests;
        parent->serviceQueue();
        parent->fireCountChanged();
      }
    }